

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

void __thiscall QCommandLineParser::showVersion(QCommandLineParser *this)

{
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>
  *in_stack_fffffffffffffed8;
  QString *in_stack_fffffffffffffee0;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *a;
  int exitCode;
  undefined6 in_stack_ffffffffffffff08;
  undefined2 uVar1;
  MessageType in_stack_ffffffffffffff14;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_d0 [3];
  long local_8;
  
  exitCode = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = local_d0;
  QCoreApplication::applicationName();
  ::operator+((QString *)a,(char16_t *)in_stack_fffffffffffffee0);
  QCoreApplication::applicationVersion();
  ::operator+(&a->a,in_stack_fffffffffffffee0);
  uVar1 = 10;
  ::operator+(a,(char16_t *)in_stack_fffffffffffffee0);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffed8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    showMessageAndExit(in_stack_ffffffffffffff14,
                       (QString *)CONCAT26(uVar1,in_stack_ffffffffffffff08),exitCode);
  }
  __stack_chk_fail();
}

Assistant:

Q_NORETURN void QCommandLineParser::showVersion()
{
    showMessageAndExit(MessageType::Information,
                       QCoreApplication::applicationName() + u' '
                       + QCoreApplication::applicationVersion() + u'\n',
                       EXIT_SUCCESS);
}